

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O2

bool try_quantize_rgb_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  undefined1 auVar1 [16];
  undefined4 in_register_00000014;
  vint4 *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar6;
  undefined1 auVar5 [64];
  float fVar7;
  float fVar10;
  undefined1 auVar8 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar9 [64];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  vfloat4 valuef;
  vfloat4 valuef_00;
  vint4 value;
  vint4 vVar19;
  float fVar14;
  float fVar16;
  float fVar17;
  float fVar18;
  
  vVar19.m[1]._4_4_ = in_register_00000014;
  vVar19.m[1]._0_4_ = quant_level;
  auVar9._8_56_ = color0._16_56_;
  auVar9._0_8_ = color0.m._8_8_;
  auVar5._8_56_ = color0._8_56_;
  auVar5._0_8_ = color0.m._0_8_;
  auVar8 = auVar9._0_16_;
  auVar3 = auVar5._0_16_;
  auVar4 = vshufps_avx(auVar3,auVar3,0xea);
  auVar4 = vsubps_avx(auVar3,auVar4);
  fVar7 = auVar4._0_4_ + color0.m[0];
  fVar10 = auVar4._4_4_ + color0.m[1];
  fVar11 = auVar4._8_4_ + color0.m[2];
  fVar12 = auVar4._12_4_ + color0.m[3];
  auVar3 = CONCAT412(fVar12,CONCAT48(fVar11,CONCAT44(fVar10,fVar7)));
  auVar4 = vshufps_avx(auVar8,auVar8,0xea);
  auVar4 = vsubps_avx(auVar8,auVar4);
  fVar14 = auVar4._0_4_ + color0.m[2];
  fVar16 = auVar4._4_4_ + color0.m[3];
  fVar17 = auVar4._8_4_ + color0._16_4_;
  fVar18 = auVar4._12_4_ + color0._20_4_;
  auVar15 = CONCAT412(fVar18,CONCAT48(fVar17,CONCAT44(fVar16,fVar14)));
  auVar4 = vcmpps_avx(auVar3,ZEXT816(0) << 0x20,1);
  auVar13._8_4_ = 0x437f0000;
  auVar13._0_8_ = 0x437f0000437f0000;
  auVar13._12_4_ = 0x437f0000;
  auVar3 = vcmpps_avx(auVar13,auVar3,1);
  auVar8 = vcmpps_avx(auVar15,ZEXT816(0) << 0x20,1);
  auVar8 = vorps_avx(auVar4,auVar8);
  auVar4 = vcmpps_avx(auVar13,auVar15,1);
  auVar4 = vorps_avx(auVar3,auVar4);
  auVar4 = vorps_avx(auVar4,auVar8);
  if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf]) {
    auVar4._0_8_ = CONCAT44((int)(fVar10 + 0.5),(int)(fVar7 + 0.5));
    auVar4._8_4_ = (int)(fVar11 + 0.5);
    auVar4._12_4_ = (int)(fVar12 + 0.5);
    valuef.m[2] = fVar7;
    valuef.m[3] = fVar10;
    valuef.m[0] = (float)(int)(fVar7 + 0.5);
    valuef.m[1] = (float)(int)(fVar10 + 0.5);
    uVar6 = auVar4._8_8_;
    vVar19.m[0] = (longlong)color1_out;
    pvVar2 = color1_out;
    vVar19 = quant_color3(quant_level,vVar19,valuef);
    value.m[1] = vVar19.m[1];
    auVar3._0_8_ = CONCAT44((int)(fVar16 + 0.5),(int)(fVar14 + 0.5));
    auVar3._8_4_ = (int)(fVar17 + 0.5);
    auVar3._12_4_ = (int)(fVar18 + 0.5);
    valuef_00.m[2] = fVar14;
    valuef_00.m[3] = fVar16;
    valuef_00.m[0] = (float)(int)(fVar14 + 0.5);
    valuef_00.m[1] = (float)(int)(fVar16 + 0.5);
    auVar15._8_8_ = auVar3._8_8_;
    auVar15._0_8_ = auVar3._0_8_;
    value.m[0] = (longlong)pvVar2;
    quant_color3(quant_level,value,valuef_00);
    auVar1._8_8_ = uVar6;
    auVar1._0_8_ = auVar4._0_8_;
    auVar4 = vphaddd_avx(auVar15,auVar15);
    auVar3 = vpshufd_avx(auVar15,0xee);
    auVar4 = vpaddd_avx(auVar4,auVar3);
    auVar3 = vphaddd_avx(auVar1,auVar1);
    auVar8 = vpshufd_avx(auVar1,0xee);
    auVar3 = vpaddd_avx(auVar3,auVar8);
    auVar4 = vpcmpgtd_avx(auVar4,auVar3);
    if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 (*) [16])color0_out->m = auVar15;
      *(undefined1 (*) [16])color1_out->m = auVar1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool try_quantize_rgb_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Quantize the inverse blue-contracted color
	vint4 color0i = quant_color3(quant_level, float_to_int_rtn(color0), color0);
	vint4 color1i = quant_color3(quant_level, float_to_int_rtn(color1), color1);

	// If color #1 is not larger than color #0 then blue-contraction cannot be used
	// We must test afterwards because quantization can change the order
	if (hadd_rgb_s(color1i) <= hadd_rgb_s(color0i))
	{
		return false;
	}

	color0_out = color1i;
	color1_out = color0i;
	return true;
}